

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall
aeron::ClientConductor::onAvailableImage
          (ClientConductor *this,int32_t streamId,int32_t sessionId,string *logFilename,
          string *sourceIdentity,int32_t subscriberPositionIndicatorId,
          int64_t subscriberPositionRegistrationId,int64_t correlationId)

{
  anon_class_64_8_bac9ab00 __f;
  SubscriptionStateDefn *in_RCX;
  long in_RDI;
  long lVar1;
  undefined8 in_R8;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_fffffffffffffed8;
  lock_guard<std::recursive_mutex> *in_stack_fffffffffffffee0;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff30 [16];
  undefined1 local_24 [4];
  undefined8 local_20;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  local_18;
  undefined1 local_10 [16];
  
  local_20 = in_R8;
  local_18._M_current = in_RCX;
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  lVar1 = in_RDI + 0x60;
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::begin((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           *)in_stack_fffffffffffffed8);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::end((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
         *)in_stack_fffffffffffffed8);
  __f.correlationId = (int64_t *)local_10;
  __f.streamId = (int32_t *)local_24;
  __f.subscriberPositionRegistrationId = (int64_t *)local_20;
  __f.logFilename = (string *)in_stack_ffffffffffffff18;
  __f.this = (ClientConductor *)lVar1;
  __f.subscriberPositionIndicatorId = (int32_t *)in_RDI;
  __f.sessionId = (int32_t *)in_stack_ffffffffffffff30._0_8_;
  __f.sourceIdentity = (string *)in_stack_ffffffffffffff30._8_8_;
  std::
  for_each<__gnu_cxx::__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn*,std::vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>>,aeron::ClientConductor::onAvailableImage(int,int,std::__cxx11::string_const&,std::__cxx11::string_const&,int,long,long)::__0>
            (local_18,(SubscriptionStateDefn *)&stack0x00000008,__f);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c7a5b);
  return;
}

Assistant:

void ClientConductor::onAvailableImage(
    std::int32_t streamId,
    std::int32_t sessionId,
    const std::string &logFilename,
    const std::string &sourceIdentity,
    std::int32_t subscriberPositionIndicatorId,
    std::int64_t subscriberPositionRegistrationId,
    std::int64_t correlationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::for_each(m_subscriptions.begin(), m_subscriptions.end(),
        [&](const SubscriptionStateDefn &entry)
        {
            if (streamId == entry.m_streamId)
            {
                std::shared_ptr<Subscription> subscription = entry.m_subscription.lock();

                if (subscription != nullptr &&
                    !(subscription->hasImage(correlationId)) &&
                    subscriberPositionRegistrationId == subscription->registrationId())
                {
                    std::shared_ptr<LogBuffers> logBuffers = std::make_shared<LogBuffers>(logFilename.c_str());

                    UnsafeBufferPosition subscriberPosition(m_counterValuesBuffer, subscriberPositionIndicatorId);

                    Image image(
                        sessionId,
                        correlationId,
                        subscription->registrationId(),
                        sourceIdentity,
                        subscriberPosition,
                        logBuffers,
                        m_errorHandler);

                    entry.m_onAvailableImageHandler(image);

                    struct ImageList *oldImageList = subscription->addImage(image);

                    if (nullptr != oldImageList)
                    {
                        lingerResource(m_epochClock(), oldImageList);
                    }
                }
            }
        });
}